

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void __thiscall bgui::BaseWindow::sendClose(BaseWindow *this)

{
  Display *pDVar1;
  BaseWindowData *pBVar2;
  XEvent event;
  undefined4 local_e0 [6];
  Display *local_c8;
  Window local_c0;
  Atom local_b8;
  undefined4 local_b0;
  Atom local_a8;
  
  if (this->p->running == true) {
    pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
    pBVar2 = this->p;
    pDVar1 = pBVar2->display;
    if (pDVar1 != (Display *)0x0) {
      memset(local_e0,0,0xc0);
      local_e0[0] = 0x21;
      local_c0 = pBVar2->window;
      local_b8 = pBVar2->wm_delete_window;
      local_b0 = 0x20;
      local_c8 = pDVar1;
      local_a8 = local_b8;
      XSendEvent(pDVar1,local_c0,0,0,local_e0);
      XFlush(this->p->display);
      pBVar2 = this->p;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pBVar2->mutex);
  }
  return;
}

Assistant:

void BaseWindow::sendClose()
{
  XEvent event;

  if (p->running)
  {
    pthread_mutex_lock(&(p->mutex));

    // request to close the window

    if (p->display != NULL)
    {
      memset(&event, 0, sizeof(XEvent));
      event.type=ClientMessage;
      event.xclient.display=p->display;
      event.xclient.window=p->window;
      event.xclient.message_type=p->wm_delete_window;
      event.xclient.format=32;
      event.xclient.data.l[0]=p->wm_delete_window;

      XSendEvent(p->display, p->window, False, 0, &event);
      XFlush(p->display);
    }

    pthread_mutex_unlock(&(p->mutex));
  }
}